

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# add_offset.c
# Opt level: O1

int setup_container_add_offset_test(void **state_)

{
  char cVar1;
  ushort uVar2;
  ushort uVar3;
  void *pvVar4;
  long lVar5;
  long lVar6;
  rle16_t *prVar7;
  ulong uVar8;
  bool bVar9;
  int iVar10;
  run_container_t *run;
  array_container_t *container;
  int iVar11;
  uint uVar12;
  uint uVar13;
  long lVar14;
  ulong uVar15;
  void *pvVar16;
  
  pvVar4 = *state_;
  lVar5 = *(long *)((long)pvVar4 + 8);
  lVar6 = *(long *)((long)pvVar4 + 0x10);
  cVar1 = *(char *)((long)pvVar4 + 0x1a);
  if (cVar1 == '\x03') {
    run = run_container_create();
    _assert_true((ulong)(run != (run_container_t *)0x0),"rc != NULL",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/add_offset.c"
                 ,0x3d);
    if (lVar6 != 0) {
      lVar14 = 0;
      do {
        run_container_add(run,*(uint16_t *)(lVar5 + lVar14 * 2));
        lVar14 = lVar14 + 1;
      } while (lVar6 != lVar14);
    }
  }
  else {
    if (cVar1 == '\x02') {
      container = array_container_create();
      _assert_true((ulong)(container != (array_container_t *)0x0),"ac != NULL",
                   "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/add_offset.c"
                   ,0x35);
      if (lVar6 != 0) {
        lVar14 = 0;
        pvVar16 = pvVar4;
        do {
          uVar2 = *(ushort *)(lVar5 + lVar14 * 2);
          iVar10 = container->cardinality;
          if (((long)iVar10 == 0) ||
             ((iVar10 != 0x7fffffff && (container->array[(long)iVar10 + -1] < uVar2)))) {
            if (iVar10 == container->capacity) {
              array_container_grow(container,container->capacity + 1,true);
            }
            iVar10 = container->cardinality;
            container->cardinality = iVar10 + 1;
            container->array[iVar10] = uVar2;
          }
          else {
            iVar11 = iVar10 + -1;
            uVar13 = 0;
            do {
              if (iVar11 < (int)uVar13) {
                pvVar16 = (void *)(ulong)~uVar13;
                break;
              }
              uVar12 = uVar13 + iVar11 >> 1;
              uVar3 = *(ushort *)((long)container->array + (ulong)(uVar13 + iVar11 & 0xfffffffe));
              if (uVar3 < uVar2) {
                uVar13 = uVar12 + 1;
                bVar9 = true;
              }
              else if (uVar2 < uVar3) {
                iVar11 = uVar12 - 1;
                bVar9 = true;
              }
              else {
                bVar9 = false;
                pvVar16 = (void *)(ulong)uVar12;
              }
            } while (bVar9);
            if ((iVar10 != 0x7fffffff) && ((int)(uint)pvVar16 < 0)) {
              if (iVar10 == container->capacity) {
                array_container_grow(container,container->capacity + 1,true);
              }
              uVar13 = ~(uint)pvVar16;
              pvVar16 = (void *)(ulong)uVar13;
              memmove(container->array + (long)pvVar16 + 1,container->array + (long)pvVar16,
                      (long)(int)(iVar10 - uVar13) * 2);
              container->array[(long)pvVar16] = uVar2;
              container->cardinality = container->cardinality + 1;
            }
          }
          lVar14 = lVar14 + 1;
        } while (lVar14 != lVar6);
      }
      *(array_container_t **)((long)pvVar4 + 0x20) = container;
      return 0;
    }
    if (cVar1 != '\x01') {
      _assert_true(0,"false",
                   "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/add_offset.c"
                   ,0x44);
      return 0;
    }
    run = (run_container_t *)bitset_container_create();
    _assert_true((ulong)(run != (run_container_t *)0x0),"bc != NULL",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/add_offset.c"
                 ,0x2d);
    if (lVar6 != 0) {
      prVar7 = run->runs;
      iVar10 = run->n_runs;
      lVar14 = 0;
      do {
        uVar2 = *(ushort *)(lVar5 + lVar14 * 2);
        uVar8 = *(ulong *)(prVar7 + (ulong)(uVar2 >> 6) * 2);
        uVar15 = uVar8 | 1L << ((ulong)uVar2 & 0x3f);
        iVar10 = iVar10 + (int)((uVar8 ^ uVar15) >> ((byte)uVar2 & 0x3f));
        *(ulong *)(prVar7 + (ulong)(uVar2 >> 6) * 2) = uVar15;
        lVar14 = lVar14 + 1;
      } while (lVar6 != lVar14);
      run->n_runs = iVar10;
    }
  }
  *(run_container_t **)((long)pvVar4 + 0x20) = run;
  return 0;
}

Assistant:

static int setup_container_add_offset_test(void **state_) {
    container_add_offset_test_state_t *state =
        *(container_add_offset_test_state_t **)state_;
    container_add_offset_test_case_t test = state->test_case;
    bitset_container_t *bc;
    array_container_t *ac;
    run_container_t *rc;

    switch (test.type) {
        case BITSET_CONTAINER_TYPE:
            bc = bitset_container_create();
            assert_true(bc != NULL);
            for (size_t i = 0; i < test.n_values; i++) {
                bitset_container_add(bc, test.values[i]);
            }
            state->in = bc;
            break;
        case ARRAY_CONTAINER_TYPE:
            ac = array_container_create();
            assert_true(ac != NULL);
            for (size_t i = 0; i < test.n_values; i++) {
                array_container_add(ac, test.values[i]);
            }
            state->in = ac;
            break;
        case RUN_CONTAINER_TYPE:
            rc = run_container_create();
            assert_true(rc != NULL);
            for (size_t i = 0; i < test.n_values; i++) {
                run_container_add(rc, test.values[i]);
            }
            state->in = rc;
            break;
        default:
            assert_true(false);  // To catch buggy tests.
    }

    return 0;
}